

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

char * parse_text(char *data,char delim,uint *len)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  LY_ERR *pLVar4;
  ushort **ppuVar5;
  bool bVar6;
  int local_44c;
  int32_t n;
  int cdsect;
  int size;
  int o;
  uint r;
  char *aux;
  char *result;
  char buf [1024];
  uint *len_local;
  char delim_local;
  char *data_local;
  
  aux = (char *)0x0;
  n = 0;
  bVar1 = false;
  cdsect = 0;
  *len = 0;
  buf._1016_8_ = len;
  do {
    bVar6 = true;
    if (!bVar1) {
      bVar6 = data[*(uint *)buf._1016_8_] != delim;
    }
    if (bVar6) {
      if ((data[*(uint *)buf._1016_8_] == '\0') ||
         ((!bVar1 && (iVar3 = strncmp(data + *(uint *)buf._1016_8_,"]]>",3), iVar3 == 0)))) {
        ly_vlog(LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,"element content, \"]]>\" found");
LAB_0012bd2d:
        free(aux);
        return (char *)0x0;
      }
    }
    else if ((delim != '<') ||
            (iVar3 = strncmp(data + *(uint *)buf._1016_8_,"<![CDATA[",9), iVar3 != 0)) {
      if (cdsect != 0) {
        if (aux == (char *)0x0) {
          n = cdsect;
          aux = (char *)malloc((long)(cdsect + 1));
        }
        else {
          n = n + cdsect;
          aux = (char *)realloc(aux,(long)(n + 1));
        }
        if (aux == (char *)0x0) {
          pLVar4 = ly_errno_location();
          *pLVar4 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","parse_text");
          return (char *)0x0;
        }
        memcpy(aux + (n - cdsect),&result,(long)cdsect);
      }
      if (aux == (char *)0x0) {
        aux = strdup("");
      }
      else {
        aux[n] = '\0';
      }
      return aux;
    }
    if (0x3fc < cdsect) {
      if (aux == (char *)0x0) {
        n = cdsect;
        aux = (char *)malloc((long)(cdsect + 1));
      }
      else {
        n = n + cdsect;
        aux = (char *)ly_realloc(aux,(long)(n + 1));
      }
      if (aux == (char *)0x0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","parse_text");
        return (char *)0x0;
      }
      memcpy(aux + (n - cdsect),&result,(long)cdsect);
      cdsect = 0;
    }
    if ((bVar1) || (iVar3 = strncmp(data + *(uint *)buf._1016_8_,"<![CDATA[",9), iVar3 == 0)) {
      if (!bVar1) {
        bVar1 = true;
        *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 9;
      }
      if ((data[*(uint *)buf._1016_8_] == '\0') ||
         (iVar3 = strncmp(data + *(uint *)buf._1016_8_,"]]>",3), iVar3 != 0)) {
        buf[(long)cdsect + -8] = data[*(uint *)buf._1016_8_];
        *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 1;
      }
      else {
        *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 3;
        bVar1 = false;
        cdsect = cdsect + -1;
      }
    }
    else if (data[*(uint *)buf._1016_8_] == '&') {
      *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 1;
      if (data[*(uint *)buf._1016_8_] == '#') {
        *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 1;
        ppuVar5 = __ctype_b_loc();
        if (((*ppuVar5)[(int)data[*(uint *)buf._1016_8_]] & 0x800) == 0) {
          uVar2 = *(uint *)buf._1016_8_;
          *(uint *)buf._1016_8_ = uVar2 + 1;
          if ((data[uVar2] != 'x') ||
             (ppuVar5 = __ctype_b_loc(),
             ((*ppuVar5)[(int)data[*(uint *)buf._1016_8_]] & 0x1000) == 0)) {
            ly_vlog(LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,"character reference");
            goto LAB_0012bd2d;
          }
          local_44c = 0;
          while (ppuVar5 = __ctype_b_loc(),
                ((*ppuVar5)[(int)data[*(uint *)buf._1016_8_]] & 0x1000) != 0) {
            ppuVar5 = __ctype_b_loc();
            if (((*ppuVar5)[(int)data[*(uint *)buf._1016_8_]] & 0x800) == 0) {
              if (data[*(uint *)buf._1016_8_] < 'G') {
                size = data[*(uint *)buf._1016_8_] + -0x37;
              }
              else {
                size = data[*(uint *)buf._1016_8_] + -0x57;
              }
            }
            else {
              size = data[*(uint *)buf._1016_8_] + -0x30;
            }
            local_44c = local_44c * 0x10 + size;
            *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 1;
          }
        }
        else {
          local_44c = 0;
          while (ppuVar5 = __ctype_b_loc(),
                ((*ppuVar5)[(int)data[*(uint *)buf._1016_8_]] & 0x800) != 0) {
            local_44c = local_44c * 10 + data[*(uint *)buf._1016_8_] + -0x30;
            *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 1;
          }
          if (data[*(uint *)buf._1016_8_] != ';') {
            ly_vlog(LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,"character reference, missing semicolon")
            ;
            goto LAB_0012bd2d;
          }
        }
        uVar2 = pututf8(buf + (long)cdsect + -8,local_44c);
        if (uVar2 == 0) {
          ly_vlog(LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,"character reference value");
          goto LAB_0012bd2d;
        }
        cdsect = (uVar2 - 1) + cdsect;
        *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 1;
      }
      else {
        iVar3 = strncmp(data + *(uint *)buf._1016_8_,"lt;",3);
        if (iVar3 == 0) {
          buf[(long)cdsect + -8] = '<';
          *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 3;
        }
        else {
          iVar3 = strncmp(data + *(uint *)buf._1016_8_,"gt;",3);
          if (iVar3 == 0) {
            buf[(long)cdsect + -8] = '>';
            *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 3;
          }
          else {
            iVar3 = strncmp(data + *(uint *)buf._1016_8_,"amp;",4);
            if (iVar3 == 0) {
              buf[(long)cdsect + -8] = '&';
              *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 4;
            }
            else {
              iVar3 = strncmp(data + *(uint *)buf._1016_8_,"apos;",5);
              if (iVar3 == 0) {
                buf[(long)cdsect + -8] = '\'';
                *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 5;
              }
              else {
                iVar3 = strncmp(data + *(uint *)buf._1016_8_,"quot;",5);
                if (iVar3 != 0) {
                  ly_vlog(LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,
                          "entity reference (only predefined references are supported)");
                  goto LAB_0012bd2d;
                }
                buf[(long)cdsect + -8] = '\"';
                *(int *)buf._1016_8_ = *(int *)buf._1016_8_ + 5;
              }
            }
          }
        }
      }
    }
    else {
      uVar2 = copyutf8(buf + (long)cdsect + -8,data + *(uint *)buf._1016_8_);
      if (uVar2 == 0) goto LAB_0012bd2d;
      cdsect = (uVar2 - 1) + cdsect;
      *(uint *)buf._1016_8_ = *(int *)buf._1016_8_ + uVar2;
    }
    cdsect = cdsect + 1;
  } while( true );
}

Assistant:

static char *
parse_text(const char *data, char delim, unsigned int *len)
{
#define BUFSIZE 1024

    char buf[BUFSIZE];
    char *result = NULL, *aux;
    unsigned int r;
    int o, size = 0;
    int cdsect = 0;
    int32_t n;

    for (*len = o = 0; cdsect || data[*len] != delim; o++) {
        if (!data[*len] || (!cdsect && !strncmp(&data[*len], "]]>", 3))) {
            LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "element content, \"]]>\" found");
            goto error;
        }

loop:

        if (o > BUFSIZE - 4) {
            /* add buffer into the result */
            if (result) {
                size = size + o;
                aux = ly_realloc(result, size + 1);
                result = aux;
            } else {
                size = o;
                result = malloc((size + 1) * sizeof *result);
            }
            if (!result) {
                LOGMEM;
                return NULL;
            }
            memcpy(&result[size - o], buf, o);

            /* write again into the beginning of the buffer */
            o = 0;
        }

        if (cdsect || !strncmp(&data[*len], "<![CDATA[", 9)) {
            /* CDSect */
            if (!cdsect) {
                cdsect = 1;
                *len += 9;
            }
            if (data[*len] && !strncmp(&data[*len], "]]>", 3)) {
                *len += 3;
                cdsect = 0;
                o--;            /* we don't write any data in this iteration */
            } else {
                buf[o] = data[*len];
                (*len)++;
            }
        } else if (data[*len] == '&') {
            (*len)++;
            if (data[*len] != '#') {
                /* entity reference - only predefined refs are supported */
                if (!strncmp(&data[*len], "lt;", 3)) {
                    buf[o] = '<';
                    *len += 3;
                } else if (!strncmp(&data[*len], "gt;", 3)) {
                    buf[o] = '>';
                    *len += 3;
                } else if (!strncmp(&data[*len], "amp;", 4)) {
                    buf[o] = '&';
                    *len += 4;
                } else if (!strncmp(&data[*len], "apos;", 5)) {
                    buf[o] = '\'';
                    *len += 5;
                } else if (!strncmp(&data[*len], "quot;", 5)) {
                    buf[o] = '\"';
                    *len += 5;
                } else {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "entity reference (only predefined references are supported)");
                    goto error;
                }
            } else {
                /* character reference */
                (*len)++;
                if (isdigit(data[*len])) {
                    for (n = 0; isdigit(data[*len]); (*len)++) {
                        n = (10 * n) + (data[*len] - '0');
                    }
                    if (data[*len] != ';') {
                        LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference, missing semicolon");
                        goto error;
                    }
                } else if (data[(*len)++] == 'x' && isxdigit(data[*len])) {
                    for (n = 0; isxdigit(data[*len]); (*len)++) {
                        if (isdigit(data[*len])) {
                            r = (data[*len] - '0');
                        } else if (data[*len] > 'F') {
                            r = 10 + (data[*len] - 'a');
                        } else {
                            r = 10 + (data[*len] - 'A');
                        }
                        n = (16 * n) + r;
                    }
                } else {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference");
                    goto error;

                }
                r = pututf8(&buf[o], n);
                if (!r) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference value");
                    goto error;
                }
                o += r - 1;     /* o is ++ in for loop */
                (*len)++;
            }
        } else {
            r = copyutf8(&buf[o], &data[*len]);
            if (!r) {
                goto error;
            }

            o += r - 1;     /* o is ++ in for loop */
            (*len) = (*len) + r;
        }
    }

    if (delim == '<' && !strncmp(&data[*len], "<![CDATA[", 9)) {
        /* ignore loop's end condition on beginning of CDSect */
        goto loop;
    }
#undef BUFSIZE

    if (o) {
        if (result) {
            size = size + o;
            aux = realloc(result, size + 1);
            result = aux;
        } else {
            size = o;
            result = malloc((size + 1) * sizeof *result);
        }
        if (!result) {
            LOGMEM;
            return NULL;
        }
        memcpy(&result[size - o], buf, o);
    }
    if (result) {
        result[size] = '\0';
    } else {
        size = 0;
        result = strdup("");
    }

    return result;

error:
    free(result);
    return NULL;
}